

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsObjectGetOwnPropertyDescriptor
          (JsValueRef object,JsValueRef propertyId,JsValueRef *propertyDescriptor)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JsErrorCode exitStatus;
  JsrtContext *pJVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 auStack_78 [8];
  TTDRecorder _actionEntryPopper;
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  auStack_78 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar5 = JsrtContext::GetCurrent();
  if (pJVar5 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_00366076;
  }
  scriptContext = (((pJVar5->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&_actionEntryPopper.m_resultPtr,scriptContext,
             (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                       ,0x66a,"(false)","Need to implement support here!!!");
    if (!bVar3) goto LAB_0036634b;
    *puVar6 = 0;
  }
  exitStatus = JsErrorInvalidArgument;
  if (object == (JsValueRef)0x0) {
LAB_00366064:
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
  }
  else {
    BVar4 = Js::JavascriptOperators::IsObject(object);
    if (BVar4 == 0) {
      exitStatus = JsErrorArgumentNotObject;
      goto LAB_00366064;
    }
    pRVar7 = Js::VarTo<Js::RecyclableObject>(object);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      exitStatus = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00366064;
      object = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
    }
    exitStatus = JsErrorInvalidArgument;
    if ((ulong)propertyId >> 0x30 != 0 || propertyId == (JsValueRef)0x0) goto LAB_00366064;
    pRVar7 = Js::VarTo<Js::RecyclableObject>(propertyId);
    pSVar1 = (((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
    if (pSVar1 != scriptContext) {
      exitStatus = JsErrorWrongRuntime;
      if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00366064;
      propertyId = Js::CrossSite::MarshalVar(scriptContext,pRVar7,false);
    }
    if (propertyDescriptor == (JsValueRef *)0x0) {
      exitStatus = JsErrorNullArgument;
      goto LAB_00366064;
    }
    *propertyDescriptor = (JsValueRef)0x0;
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    pRVar7 = Js::VarTo<Js::RecyclableObject>(propertyId);
    exitStatus = InternalGetPropertyRecord
                           (scriptContext,pRVar7,(PropertyRecord **)&__enterScriptObject.library);
    if (exitStatus != JsNoError) goto LAB_00366064;
    if (__enterScriptObject.library == (JavascriptLibrary *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                         ,0x67a,"(propertyRecord != nullptr)","propertyRecord != nullptr");
      if (!bVar3) {
LAB_0036634b:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    JsGetOwnPropertyDescriptorCommon
              (scriptContext,object,(PropertyRecord *)__enterScriptObject.library,propertyDescriptor
              );
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&_actionEntryPopper.m_resultPtr);
    exitStatus = JsNoError;
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
LAB_00366076:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_78,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsObjectGetOwnPropertyDescriptor(_In_ JsValueRef object, _In_ JsValueRef propertyId, _Out_ JsValueRef *propertyDescriptor)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_RECYCLABLE(propertyId, scriptContext);
        PARAM_NOT_NULL(propertyDescriptor);
        *propertyDescriptor = nullptr;

        const Js::PropertyRecord *propertyRecord = nullptr;
        JsErrorCode errorValue = InternalGetPropertyRecord(scriptContext,
            Js::VarTo<Js::RecyclableObject>(propertyId), &propertyRecord);

        if (errorValue != JsNoError)
        {
            return errorValue;
        }

        Assert(propertyRecord != nullptr);

        return JsGetOwnPropertyDescriptorCommon(scriptContext, object, propertyRecord, propertyDescriptor);
    });
}